

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O3

HTTP_CLIENT_RESULT
uhttp_client_open(HTTP_CLIENT_HANDLE handle,char *host,int port_num,
                 ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect,void *callback_ctx)

{
  RESPONSE_MESSAGE_STATE RVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  HTTP_CLIENT_RESULT HVar4;
  char *pcVar5;
  
  if (handle == (HTTP_CLIENT_HANDLE)0x0 || host == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    HVar4 = HTTP_CLIENT_INVALID_ARG;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_ARG;
    }
    pcVar5 = "Invalid handle value";
    iVar2 = 0x47c;
LAB_00103f86:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
              "uhttp_client_open",iVar2,1,pcVar5);
    return HVar4;
  }
  RVar1 = (handle->recv_msg).recv_state;
  if ((state_error < RVar1) || ((0xc01U >> (RVar1 & 0x1f) & 1) == 0)) {
    p_Var3 = xlogging_get_log_function();
    HVar4 = HTTP_CLIENT_INVALID_STATE;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_STATE;
    }
    pcVar5 = "Unable to open previously open client.";
    iVar2 = 0x487;
    goto LAB_00103f86;
  }
  if (handle->host_name != (char *)0x0) {
    free(handle->host_name);
    handle->host_name = (char *)0x0;
  }
  iVar2 = mallocAndStrcpy_s(&handle->host_name,host);
  if (iVar2 != 0) {
    p_Var3 = xlogging_get_log_function();
    HVar4 = HTTP_CLIENT_ERROR;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_ERROR;
    }
    pcVar5 = "copying hostname has failed";
    iVar2 = 0x494;
    goto LAB_00103f86;
  }
  (handle->recv_msg).recv_state = state_opening;
  handle->on_connect = on_connect;
  handle->connect_user_ctx = callback_ctx;
  handle->port_num = port_num;
  if (((handle->x509_cert == (char *)0x0) || (handle->x509_pk == (char *)0x0)) ||
     ((iVar2 = xio_setoption(handle->xio_handle,"x509certificate",handle->x509_cert), iVar2 == 0 &&
      (iVar2 = xio_setoption(handle->xio_handle,"x509privatekey",handle->x509_pk), iVar2 == 0)))) {
    if ((handle->certificate == (char *)0x0) ||
       (iVar2 = xio_setoption(handle->xio_handle,"TrustedCerts",handle->certificate), iVar2 == 0)) {
      iVar2 = xio_open(handle->xio_handle,on_xio_open_complete,handle,on_bytes_received,handle,
                       on_io_error,handle);
      if (iVar2 != 0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"uhttp_client_open",0x4c2,1,"opening xio failed");
        }
        free(handle->host_name);
        handle->host_name = (char *)0x0;
        handle->port_num = 0;
        handle->on_connect = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
        handle->connect_user_ctx = (void *)0x0;
        (handle->recv_msg).recv_state = state_error;
        return HTTP_CLIENT_OPEN_FAILED;
      }
      return HTTP_CLIENT_OK;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00103ff5;
    pcVar5 = "Failed setting Trusted certificate";
    iVar2 = 0x4b3;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00103ff5;
    pcVar5 = "Failed setting x509 certificate";
    iVar2 = 0x4a5;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
            "uhttp_client_open",iVar2,1,pcVar5);
LAB_00103ff5:
  free(handle->host_name);
  handle->host_name = (char *)0x0;
  handle->port_num = 0;
  handle->on_connect = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
  handle->connect_user_ctx = (void *)0x0;
  return HTTP_CLIENT_ERROR;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_open(HTTP_CLIENT_HANDLE handle, const char* host, int port_num, ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect, void* callback_ctx)
{
    HTTP_CLIENT_RESULT result;
    if (handle == NULL || host == NULL)
    {
        /* Codes_SRS_UHTTP_07_006: [If handle, io_interface_desc or host is NULL then `uhttp_client_open` shall return HTTP_CLIENT_INVALID_ARG] */
        LogError("Invalid handle value");
        result = HTTP_CLIENT_INVALID_ARG;
    }
    else
    {
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;

        if ((http_data->recv_msg.recv_state != state_initial) &&
            (http_data->recv_msg.recv_state != state_error) &&
            (http_data->recv_msg.recv_state != state_closed))
        {
            LogError("Unable to open previously open client.");
            result = HTTP_CLIENT_INVALID_STATE;
        }
        else
        {
            if (http_data->host_name != NULL)
            {
                free(http_data->host_name);
                handle->host_name = NULL;
            }

            if (mallocAndStrcpy_s(&http_data->host_name, host) != 0)
            {
                LogError("copying hostname has failed");
                result = HTTP_CLIENT_ERROR;
            }
            /* Codes_SRS_UHTTP_07_007: [http_client_connect shall attempt to open the xio_handle. ] */
            else
            {
                result = HTTP_CLIENT_OK;
                http_data->recv_msg.recv_state = state_opening;
                http_data->on_connect = on_connect;
                http_data->connect_user_ctx = callback_ctx;
                http_data->port_num = port_num;

                if ((http_data->x509_cert != NULL) && (http_data->x509_pk != NULL))
                {
                    if ((xio_setoption(http_data->xio_handle, SU_OPTION_X509_CERT, http_data->x509_cert) != 0) ||
                        (xio_setoption(http_data->xio_handle, SU_OPTION_X509_PRIVATE_KEY, http_data->x509_pk) != 0))
                    {
                        LogError("Failed setting x509 certificate");
                        result = HTTP_CLIENT_ERROR;
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                    }
                }

                if ((result == HTTP_CLIENT_OK) && (http_data->certificate != NULL))
                {
                    if (xio_setoption(http_data->xio_handle, OPTION_TRUSTED_CERT, http_data->certificate) != 0)
                    {
                        LogError("Failed setting Trusted certificate");
                        result = HTTP_CLIENT_ERROR;
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                    }
                }

                if (result == HTTP_CLIENT_OK)
                {
                    if (xio_open(http_data->xio_handle, on_xio_open_complete, http_data, on_bytes_received, http_data, on_io_error, http_data) != 0)
                    {
                        /* Codes_SRS_UHTTP_07_044: [ if a failure is encountered on xio_open uhttp_client_open shall return HTTP_CLIENT_OPEN_REQUEST_FAILED. ] */
                        LogError("opening xio failed");
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                        http_data->recv_msg.recv_state = state_error;

                        result = HTTP_CLIENT_OPEN_FAILED;
                    }
                    else
                    {
                        /* Codes_SRS_UHTTP_07_008: [If http_client_connect succeeds then it shall return HTTP_CLIENT_OK] */
                        result = HTTP_CLIENT_OK;
                    }
                }
            }
        }
    }
    return result;
}